

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# jpgd.cpp
# Opt level: O2

void __thiscall jpgd::jpeg_decoder::H2V2Convert(jpeg_decoder *this)

{
  byte bVar1;
  int iVar2;
  uint8 *puVar3;
  uint8 *puVar4;
  uint8 *puVar5;
  uint8 *puVar6;
  int iVar7;
  long lVar8;
  uint8 *puVar9;
  int iVar10;
  int iVar11;
  uint uVar12;
  int iVar13;
  int iVar14;
  uint8 *puVar15;
  long lVar16;
  int j;
  ulong uVar17;
  
  lVar8 = (long)this->m_max_mcu_y_size - (long)this->m_mcu_lines_left;
  puVar5 = this->m_pScan_line_0;
  puVar4 = this->m_pScan_line_1;
  uVar12 = (uint)lVar8;
  lVar16 = (ulong)(uVar12 & 7) * 8 + 0x80;
  if ((int)uVar12 < 8) {
    lVar16 = lVar8 * 8;
  }
  puVar3 = this->m_pSample_buf + lVar16;
  puVar15 = this->m_pSample_buf + (long)(int)(uVar12 * 4 & 0xfffffff8) + 0x100;
  for (iVar7 = this->m_max_mcus_per_row; 0 < iVar7; iVar7 = iVar7 + -1) {
    for (iVar11 = 0; iVar11 != 2; iVar11 = iVar11 + 1) {
      lVar16 = 0;
      puVar6 = puVar4;
      puVar9 = puVar5;
      for (uVar17 = 0; uVar17 < 8; uVar17 = uVar17 + 2) {
        iVar10 = this->m_crr[puVar15[lVar16 + 0x40]];
        uVar12 = (uint)puVar3[lVar16 * 2];
        iVar13 = iVar10 + uVar12;
        if (iVar13 < 1) {
          iVar13 = 0;
        }
        if (0xfe < iVar13) {
          iVar13 = 0xff;
        }
        iVar14 = this->m_cbg[puVar15[lVar16]] + this->m_crg[puVar15[lVar16 + 0x40]] >> 0x10;
        iVar2 = this->m_cbb[puVar15[lVar16]];
        puVar5[lVar16 * 8] = (uint8)iVar13;
        iVar13 = iVar14 + uVar12;
        if (iVar13 < 1) {
          iVar13 = 0;
        }
        if (0xfe < iVar13) {
          iVar13 = 0xff;
        }
        puVar5[lVar16 * 8 + 1] = (uint8)iVar13;
        iVar13 = uVar12 + iVar2;
        if (iVar13 < 1) {
          iVar13 = 0;
        }
        if (0xfe < iVar13) {
          iVar13 = 0xff;
        }
        puVar5[lVar16 * 8 + 2] = (uint8)iVar13;
        puVar5[lVar16 * 8 + 3] = 0xff;
        uVar12 = (uint)puVar3[lVar16 * 2 + 1];
        iVar13 = iVar10 + uVar12;
        if (iVar13 < 1) {
          iVar13 = 0;
        }
        if (0xfe < iVar13) {
          iVar13 = 0xff;
        }
        puVar5[lVar16 * 8 + 4] = (uint8)iVar13;
        iVar13 = iVar14 + uVar12;
        if (iVar13 < 1) {
          iVar13 = 0;
        }
        if (0xfe < iVar13) {
          iVar13 = 0xff;
        }
        puVar5[lVar16 * 8 + 5] = (uint8)iVar13;
        iVar13 = uVar12 + iVar2;
        if (iVar13 < 1) {
          iVar13 = 0;
        }
        if (0xfe < iVar13) {
          iVar13 = 0xff;
        }
        puVar5[lVar16 * 8 + 6] = (uint8)iVar13;
        puVar5[lVar16 * 8 + 7] = 0xff;
        uVar12 = (uint)puVar3[lVar16 * 2 + 8];
        iVar13 = iVar10 + uVar12;
        if (iVar13 < 1) {
          iVar13 = 0;
        }
        if (0xfe < iVar13) {
          iVar13 = 0xff;
        }
        puVar4[lVar16 * 8] = (uint8)iVar13;
        iVar13 = iVar14 + uVar12;
        if (iVar13 < 1) {
          iVar13 = 0;
        }
        if (0xfe < iVar13) {
          iVar13 = 0xff;
        }
        puVar4[lVar16 * 8 + 1] = (uint8)iVar13;
        iVar13 = uVar12 + iVar2;
        if (iVar13 < 1) {
          iVar13 = 0;
        }
        if (0xfe < iVar13) {
          iVar13 = 0xff;
        }
        puVar4[lVar16 * 8 + 2] = (uint8)iVar13;
        puVar4[lVar16 * 8 + 3] = 0xff;
        bVar1 = puVar3[lVar16 * 2 + 9];
        iVar10 = iVar10 + (uint)bVar1;
        if (iVar10 < 1) {
          iVar10 = 0;
        }
        if (0xfe < iVar10) {
          iVar10 = 0xff;
        }
        puVar4[lVar16 * 8 + 4] = (uint8)iVar10;
        iVar14 = iVar14 + (uint)bVar1;
        if (iVar14 < 1) {
          iVar14 = 0;
        }
        if (0xfe < iVar14) {
          iVar14 = 0xff;
        }
        puVar4[lVar16 * 8 + 5] = (uint8)iVar14;
        iVar13 = 0;
        if (0 < (int)(iVar2 + (uint)bVar1)) {
          iVar13 = iVar2 + (uint)bVar1;
        }
        if (0xfe < iVar13) {
          iVar13 = 0xff;
        }
        puVar4[lVar16 * 8 + 6] = (uint8)iVar13;
        puVar4[lVar16 * 8 + 7] = 0xff;
        puVar9 = puVar9 + 8;
        puVar6 = puVar6 + 8;
        lVar16 = lVar16 + 1;
      }
      puVar3 = puVar3 + 0x40;
      puVar15 = puVar15 + lVar16;
      puVar4 = puVar6;
      puVar5 = puVar9;
    }
    puVar3 = puVar3 + 0x100;
    puVar15 = puVar15 + 0x178;
  }
  return;
}

Assistant:

void jpeg_decoder::H2V2Convert()
	{
		int row = m_max_mcu_y_size - m_mcu_lines_left;
		uint8* d0 = m_pScan_line_0;
		uint8* d1 = m_pScan_line_1;
		uint8* y;
		uint8* c;

		if (row < 8)
			y = m_pSample_buf + row * 8;
		else
			y = m_pSample_buf + 64 * 2 + (row & 7) * 8;

		c = m_pSample_buf + 64 * 4 + (row >> 1) * 8;

		for (int i = m_max_mcus_per_row; i > 0; i--)
		{
			for (int l = 0; l < 2; l++)
			{
				for (int j = 0; j < 8; j += 2)
				{
					int cb = c[0];
					int cr = c[64];

					int rc = m_crr[cr];
					int gc = ((m_crg[cr] + m_cbg[cb]) >> 16);
					int bc = m_cbb[cb];

					int yy = y[j];
					d0[0] = clamp(yy + rc);
					d0[1] = clamp(yy + gc);
					d0[2] = clamp(yy + bc);
					d0[3] = 255;

					yy = y[j + 1];
					d0[4] = clamp(yy + rc);
					d0[5] = clamp(yy + gc);
					d0[6] = clamp(yy + bc);
					d0[7] = 255;

					yy = y[j + 8];
					d1[0] = clamp(yy + rc);
					d1[1] = clamp(yy + gc);
					d1[2] = clamp(yy + bc);
					d1[3] = 255;

					yy = y[j + 8 + 1];
					d1[4] = clamp(yy + rc);
					d1[5] = clamp(yy + gc);
					d1[6] = clamp(yy + bc);
					d1[7] = 255;

					d0 += 8;
					d1 += 8;

					c++;
				}
				y += 64;
			}

			y += 64 * 6 - 64 * 2;
			c += 64 * 6 - 8;
		}
	}